

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString StringFromFormat(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t extraout_RDX;
  __va_list_tag *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  SimpleString SVar1;
  va_list arguments;
  SimpleString SStack_f8;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  format[0] = '\0';
  format[1] = '\0';
  format[2] = '\0';
  format[3] = '\0';
  format[4] = '\0';
  format[5] = '\0';
  format[6] = '\0';
  format[7] = '\0';
  format[8] = '\0';
  format[9] = '\0';
  format[10] = '\0';
  format[0xb] = '\0';
  format[0xc] = '\0';
  format[0xd] = '\0';
  format[0xe] = '\0';
  format[0xf] = '\0';
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  SimpleString::copyBufferToNewInternalBuffer((SimpleString *)format,"");
  local_e0 = &stack0x00000008;
  local_e8 = 0x3000000010;
  local_d8 = local_c8;
  VStringFromFormat((char *)&SStack_f8,in_RSI);
  SimpleString::copyBufferToNewInternalBuffer((SimpleString *)format,&SStack_f8);
  SimpleString::deallocateInternalBuffer(&SStack_f8);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = format;
  return SVar1;
}

Assistant:

SimpleString StringFromFormat(const char* format, ...)
{
    SimpleString resultString;
    va_list arguments;
    va_start(arguments, format);

    resultString = VStringFromFormat(format, arguments);
    va_end(arguments);
    return resultString;
}